

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  undefined8 uVar6;
  char cVar7;
  output_data_switch *poVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  int i;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  cpu_list_t list;
  ulong local_98;
  long lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong local_50;
  char **local_48;
  int local_40 [2];
  long local_38;
  
  local_48 = argv;
  if (argc == 1) {
    need_output = 1;
    builtin_strncpy(raw_data_file,"raw.txt",8);
    builtin_strncpy(out_file,"report.txt",0xb);
    need_report = 1;
    verbose_level = 1;
  }
  else if (1 < argc) {
    local_58 = (ulong)(uint)num_requests;
    local_70 = need_output;
    local_6c = need_input;
    local_50 = (ulong)(uint)argc;
    uVar14 = 1;
    iVar2 = verbose_level;
    do {
      pcVar10 = local_48[uVar14];
      if ((((*pcVar10 == '-') && (pcVar10[1] == 'h')) && (pcVar10[2] == '\0')) ||
         (iVar4 = strcmp(pcVar10,"--help"), iVar4 == 0)) {
        puts("Usage: cpuid_tool [options]\n");
        puts("Options:");
        puts("  -h, --help       - Show this help");
        puts("  --load=<file>    - Load raw CPUID data from file");
        puts("  --save=<file>    - Acquire raw CPUID data and write it to file");
        puts("  --report, --all  - Report all decoded CPU info (w/o clock)");
        puts("  --clock          - in conjunction to --report: print CPU clock as well");
        puts("  --clock-rdtsc    - same as --clock, but use RDTSC for clock detection");
        puts("  --cpulist        - list all known CPUs");
        puts("  --sgx            - list SGX leaf data, if SGX is supported.");
        puts("  --hypervisor     - print hypervisor vendor if detected.");
        puts("  --quiet          - disable warnings");
        puts("  --outfile=<file> - redirect all output to this file, instead of stdout");
        puts("  --verbose, -v    - be extra verbose (more keys increase verbosiness level)");
        puts("  --version        - print library version");
        putchar(10);
        printf("Query switches (generate 1 line of output per switch; in order of appearance):");
        iVar2 = 0x50;
        lVar9 = 8;
        while( true ) {
          pcVar10 = *(char **)((long)&matchtable[0].sw + lVar9);
          sVar5 = strlen(pcVar10);
          if (0x4c < (int)sVar5 + iVar2) {
            printf("\n  ");
            iVar2 = 2;
          }
          printf("%s",pcVar10);
          if (lVar9 == 0x4a0) break;
          iVar2 = iVar2 + (int)sVar5 + 2;
          printf(", ");
          lVar9 = lVar9 + 0x18;
        }
        puts("\n");
        puts("If `-\' is used for <file>, then stdin/stdout will be used instead of files.");
        puts("When no options are present, the program behaves as if it was invoked with");
        puts("  cpuid_tool \"--save=raw.txt --outfile=report.txt --report --verbose\"");
        goto LAB_001039b7;
      }
      iVar4 = strncmp(pcVar10,"--load=",7);
      if (iVar4 == 0) {
        if (local_6c != 0) {
          main_cold_3();
          return -1;
        }
        if (local_70 != 0) {
          main_cold_4();
          return -1;
        }
        sVar5 = strlen(pcVar10);
        if (sVar5 < 8) {
          main_cold_9();
          return -1;
        }
        need_input = 1;
        strcpy(raw_data_file,pcVar10 + 7);
        iVar4 = strncmp(pcVar10,"--save=",7);
        if (iVar4 == 0) {
LAB_00103a12:
          main_cold_8();
          return -1;
        }
        local_70 = 0;
        local_6c = 1;
LAB_0010290c:
        bVar15 = true;
      }
      else {
        iVar4 = strncmp(pcVar10,"--save=",7);
        bVar15 = false;
        if (iVar4 == 0) {
          if (local_70 != 0) {
            main_cold_1();
            return -1;
          }
          if (local_6c != 0) goto LAB_00103a12;
          sVar5 = strlen(pcVar10);
          if (sVar5 < 8) {
            main_cold_2();
            return -1;
          }
          need_output = 1;
          strcpy(raw_data_file,pcVar10 + 7);
          local_70 = 1;
          local_6c = 0;
          goto LAB_0010290c;
        }
      }
      iVar4 = strncmp(pcVar10,"--outfile=",10);
      if (iVar4 == 0) {
        sVar5 = strlen(pcVar10);
        if (sVar5 < 0xb) {
          main_cold_7();
          return -1;
        }
        strcpy(out_file,pcVar10 + 10);
        bVar15 = true;
      }
      iVar4 = strcmp(pcVar10,"--report");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar10,"--all"), iVar4 == 0)) {
        need_report = 1;
        bVar15 = true;
      }
      iVar4 = strcmp(pcVar10,"--clock");
      if (iVar4 == 0) {
        need_clockreport = 1;
        bVar15 = true;
      }
      iVar4 = strcmp(pcVar10,"--clock-rdtsc");
      if (iVar4 == 0) {
        bVar15 = true;
        need_clockreport = 1;
        need_timed_clockreport = 1;
      }
      iVar4 = strcmp(pcVar10,"--quiet");
      if (iVar4 == 0) {
        need_quiet = 1;
        bVar15 = true;
      }
      iVar4 = strcmp(pcVar10,"--verbose");
      if (iVar4 == 0) {
        iVar2 = iVar2 + 1;
        bVar15 = true;
        verbose_level = iVar2;
      }
      iVar4 = strcmp(pcVar10,"--version");
      if (iVar4 == 0) {
        need_version = 1;
        bVar15 = true;
      }
      iVar4 = strcmp(pcVar10,"--cpulist");
      if (iVar4 == 0) {
        need_cpulist = 1;
        bVar15 = true;
      }
      iVar4 = strcmp(pcVar10,"--sgx");
      if (iVar4 == 0) {
        bVar15 = true;
        need_sgx = 1;
        need_identify = 1;
      }
      iVar4 = strcmp(pcVar10,"--hypervisor");
      if (iVar4 == 0) {
        bVar15 = true;
        need_hypervisor = 1;
        need_identify = 1;
      }
      if ((*pcVar10 == '-') && (pcVar10[1] == 'v')) {
        lVar9 = 0;
        cVar7 = 'v';
        while (cVar7 == 'v') {
          lVar12 = lVar9 + 2;
          lVar9 = lVar9 + 1;
          cVar7 = pcVar10[lVar12];
        }
        if (cVar7 == '\0') {
          verbose_level = iVar2 + (int)lVar9;
          bVar15 = true;
          iVar2 = verbose_level;
        }
      }
      lVar9 = 8;
      do {
        iVar4 = strcmp(pcVar10,*(char **)((long)&matchtable[0].sw + lVar9));
        if (iVar4 == 0) {
          iVar4 = (int)local_58;
          if (0x3f < iVar4) {
            main_cold_6();
            return -1;
          }
          num_requests = iVar4 + 1U;
          requests[iVar4] =
               *(output_data_switch *)((long)&__do_global_dtors_aux_fini_array_entry + lVar9);
          local_58 = (ulong)(iVar4 + 1U);
          goto LAB_00102b2f;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x4b8);
      if (!bVar15) {
        main_cold_5();
        return -1;
      }
LAB_00102b2f:
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_50);
  }
  local_68 = 0;
  uStack_60 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  lStack_90 = 0;
  local_78 = 0;
  if (need_quiet != 0) {
    cpuid_set_warn_function(0);
  }
  cpuid_set_verbosiness_level(verbose_level);
  if ((out_file[0] == '\0') || (CONCAT11(out_file[1],out_file[0]) == 0x2d)) {
    fout = _stdout;
  }
  else {
    fout = (FILE *)fopen(out_file,"wt");
    if ((FILE *)fout == (FILE *)0x0) {
      if (need_quiet == 0) {
        main_cold_10();
        return -1;
      }
      return -1;
    }
    atexit(close_out);
  }
  pFVar1 = fout;
  if (need_version != 0) {
    uVar6 = cpuid_lib_version();
    fprintf((FILE *)pFVar1,"%s\n",uVar6);
  }
  if (need_input == 0) {
    iVar2 = check_need_raw_data();
    if ((iVar2 != 0) && (iVar2 = cpuid_get_all_raw_data(&local_68), iVar2 < 0)) {
      if (need_quiet == 0) {
        main_cold_12();
        return -1;
      }
      return -1;
    }
  }
  else {
    iVar2 = cpuid_deserialize_all_raw_data(&local_68);
    if (iVar2 < 0) {
      if (need_quiet == 0) {
        main_cold_11();
        return -1;
      }
      return -1;
    }
  }
  if ((need_output == 0) || (iVar2 = cpuid_serialize_all_raw_data(&local_68), -1 < iVar2)) {
    if (need_report != 0) {
      if (0 < verbose_level) {
        printf("Writing decoded CPU report to `%s\'\n",out_file);
      }
      iVar2 = cpu_identify_all(&local_68,&local_98);
      pFVar1 = fout;
      if (iVar2 < 0) {
        uVar6 = cpuid_error();
        fprintf((FILE *)pFVar1,"Error identifying the CPU: %s\n",uVar6);
      }
      else if ((char)local_98 == '\0') {
        fwrite("The cpu_types array is empty: there is nothing to report\n",0x39,1,(FILE *)fout);
      }
      else {
        fwrite("CPUID is present\n",0x11,1,(FILE *)fout);
        if ((char)local_98 != '\0') {
          lVar9 = 0x5c;
          uVar14 = 0;
          do {
            fprintf((FILE *)fout,"CPU Info for type #%d:\n------------------\n",uVar14 & 0xffffffff)
            ;
            pFVar1 = fout;
            lVar12 = uVar14 * 9000;
            uVar6 = cpu_architecture_str(*(undefined4 *)(lStack_90 + lVar12));
            fprintf((FILE *)pFVar1,"  arch       : %s\n",uVar6);
            pFVar1 = fout;
            uVar6 = cpu_feature_level_str(*(undefined4 *)(lStack_90 + 4 + lVar12));
            fprintf((FILE *)pFVar1,"  feat_level : %s\n",uVar6);
            pFVar1 = fout;
            uVar6 = cpu_purpose_str(*(undefined4 *)(lStack_90 + 0x2320 + lVar12));
            fprintf((FILE *)pFVar1,"  purpose    : %s\n",uVar6);
            fprintf((FILE *)fout,"  vendor_str : `%s\'\n",lStack_90 + lVar12 + 8);
            fprintf((FILE *)fout,"  vendor id  : %d\n",(ulong)*(uint *)(lStack_90 + 0x58 + lVar12));
            fprintf((FILE *)fout,"  brand_str  : `%s\'\n",lStack_90 + lVar12 + 0x18);
            if (*(int *)(lStack_90 + lVar12) == 1) {
              fprintf((FILE *)fout,"  implementer: %d (%02Xh)\n",
                      (ulong)*(byte *)(lStack_90 + lVar12 + 0x1f0));
              fprintf((FILE *)fout,"  variant    : %d (%02Xh)\n",
                      (ulong)*(byte *)(lStack_90 + 0x1f1 + lVar12));
              fprintf((FILE *)fout,"  part_num   : %d (%02Xh)\n",
                      (ulong)*(ushort *)(lStack_90 + 0x1f2 + lVar12));
              uVar11 = (ulong)*(byte *)(lStack_90 + 500 + lVar12);
              pcVar10 = "  revision   : %d (%02Xh)\n";
LAB_00102f60:
              fprintf((FILE *)fout,pcVar10,uVar11);
            }
            else if (*(int *)(lStack_90 + lVar12) == 0) {
              fprintf((FILE *)fout,"  family     : %d (%02Xh)\n",
                      (ulong)*(uint *)(lStack_90 + lVar12 + 0x1f0));
              fprintf((FILE *)fout,"  model      : %d (%02Xh)\n",
                      (ulong)*(uint *)(lStack_90 + 500 + lVar12));
              fprintf((FILE *)fout,"  stepping   : %d (%02Xh)\n",
                      (ulong)*(uint *)(lStack_90 + 0x1f8 + lVar12));
              fprintf((FILE *)fout,"  ext_family : %d (%02Xh)\n",
                      (ulong)*(uint *)(lStack_90 + 0x1fc + lVar12));
              uVar11 = (ulong)*(uint *)(lStack_90 + 0x200 + lVar12);
              pcVar10 = "  ext_model  : %d (%02Xh)\n";
              goto LAB_00102f60;
            }
            fprintf((FILE *)fout,"  num_cores  : %d\n",(ulong)*(uint *)(lStack_90 + 0x238 + lVar12))
            ;
            fprintf((FILE *)fout,"  num_logical: %d\n",(ulong)*(uint *)(lStack_90 + 0x23c + lVar12))
            ;
            fprintf((FILE *)fout,"  tot_logical: %d\n",(ulong)*(uint *)(lStack_90 + 0x240 + lVar12))
            ;
            pFVar1 = fout;
            uVar6 = affinity_mask_str(lStack_90 + lVar12 + 800);
            fprintf((FILE *)pFVar1,"  affi_mask  : 0x%s\n",uVar6);
            if (*(int *)(lStack_90 + lVar12) == 0) {
              fprintf((FILE *)fout,"  L1 D cache : %d KB\n",
                      (ulong)*(uint *)(lStack_90 + lVar12 + 0x244));
              fprintf((FILE *)fout,"  L1 I cache : %d KB\n",
                      (ulong)*(uint *)(lStack_90 + 0x248 + lVar12));
              fprintf((FILE *)fout,"  L2 cache   : %d KB\n",
                      (ulong)*(uint *)(lStack_90 + 0x24c + lVar12));
              fprintf((FILE *)fout,"  L3 cache   : %d KB\n",
                      (ulong)*(uint *)(lStack_90 + 0x250 + lVar12));
              fprintf((FILE *)fout,"  L4 cache   : %d KB\n",
                      (ulong)*(uint *)(lStack_90 + 0x254 + lVar12));
              fprintf((FILE *)fout,"  L1D assoc. : %d-way\n",
                      (ulong)*(uint *)(lStack_90 + 0x25c + lVar12));
              fprintf((FILE *)fout,"  L1I assoc. : %d-way\n",
                      (ulong)*(uint *)(lStack_90 + 0x260 + lVar12));
              fprintf((FILE *)fout,"  L2 assoc.  : %d-way\n",
                      (ulong)*(uint *)(lStack_90 + 0x264 + lVar12));
              fprintf((FILE *)fout,"  L3 assoc.  : %d-way\n",
                      (ulong)*(uint *)(lStack_90 + 0x268 + lVar12));
              fprintf((FILE *)fout,"  L4 assoc.  : %d-way\n",
                      (ulong)*(uint *)(lStack_90 + 0x26c + lVar12));
              fprintf((FILE *)fout,"  L1D line sz: %d bytes\n",
                      (ulong)*(uint *)(lStack_90 + 0x274 + lVar12));
              fprintf((FILE *)fout,"  L1I line sz: %d bytes\n",
                      (ulong)*(uint *)(lStack_90 + 0x278 + lVar12));
              fprintf((FILE *)fout,"  L2 line sz : %d bytes\n",
                      (ulong)*(uint *)(lStack_90 + 0x27c + lVar12));
              fprintf((FILE *)fout,"  L3 line sz : %d bytes\n",
                      (ulong)*(uint *)(lStack_90 + 0x280 + lVar12));
              fprintf((FILE *)fout,"  L4 line sz : %d bytes\n",
                      (ulong)*(uint *)(lStack_90 + 0x284 + lVar12));
              fprintf((FILE *)fout,"  L1D inst.  : %d\n",
                      (ulong)*(uint *)(lStack_90 + 0x288 + lVar12));
              fprintf((FILE *)fout,"  L1I inst.  : %d\n",
                      (ulong)*(uint *)(lStack_90 + 0x28c + lVar12));
              fprintf((FILE *)fout,"  L2 inst.   : %d\n",
                      (ulong)*(uint *)(lStack_90 + 0x290 + lVar12));
              fprintf((FILE *)fout,"  L3 inst.   : %d\n",
                      (ulong)*(uint *)(lStack_90 + 0x294 + lVar12));
              fprintf((FILE *)fout,"  L4 inst.   : %d\n",
                      (ulong)*(uint *)(lStack_90 + 0x298 + lVar12));
              pcVar10 = "authoritative";
              if (*(char *)(lStack_90 + 0x2e0 + lVar12) == '\0') {
                pcVar10 = "non-authoritative";
              }
              fprintf((FILE *)fout,"  SSE units  : %d bits (%s)\n",
                      (ulong)*(uint *)(lStack_90 + 0x204 + lVar12),pcVar10);
            }
            fprintf((FILE *)fout,"  code name  : `%s\'\n",lStack_90 + lVar12 + 0x29c);
            fwrite("  features   :",0xe,1,(FILE *)fout);
            uVar11 = 0;
            do {
              pFVar1 = fout;
              if (*(char *)(uVar11 + lStack_90 + lVar9) != '\0') {
                uVar6 = cpu_feature_str(uVar11 & 0xffffffff);
                fprintf((FILE *)pFVar1," %s",uVar6);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != 0x150);
            fputc(10,(FILE *)fout);
            uVar14 = uVar14 + 1;
            lVar9 = lVar9 + 9000;
          } while (uVar14 < (local_98 & 0xff));
        }
      }
      pFVar1 = fout;
      if (need_clockreport != 0) {
        if (need_timed_clockreport == 0) {
          uVar3 = cpu_clock();
        }
        else {
          uVar3 = cpu_clock_measure(400,1);
        }
        fprintf((FILE *)pFVar1,"  cpu clock  : %d MHz\n",(ulong)uVar3);
      }
    }
    iVar2 = num_requests;
    uVar14 = (ulong)num_requests;
    if ((long)uVar14 < 1) {
      bVar15 = false;
    }
    else {
      bVar15 = true;
      poVar8 = requests;
      uVar11 = 1;
      do {
        if ((*poVar8 != NEED_CLOCK_RDTSC) && (*poVar8 != NEED_CLOCK)) break;
        bVar15 = uVar11 < uVar14;
        poVar8 = poVar8 + 1;
        bVar16 = uVar11 != uVar14;
        uVar11 = uVar11 + 1;
      } while (bVar16);
    }
    if (((bool)(0 < num_requests & (need_report == 0 | bVar15))) || (need_identify != 0)) {
      iVar4 = check_need_raw_data();
      if (iVar4 == 0) {
        if (0 < iVar2) {
          poVar8 = requests;
          lVar9 = 0;
          do {
            print_info(*poVar8,(cpu_id_t *)0x0);
            lVar9 = lVar9 + 1;
            poVar8 = poVar8 + 1;
          } while (lVar9 < num_requests);
        }
      }
      else {
        iVar2 = cpu_identify_all(&local_68,&local_98);
        if (iVar2 < 0) {
          if (need_quiet == 0) {
            main_cold_14();
            return -1;
          }
          return -1;
        }
        if ((char)local_98 != '\0') {
          uVar14 = 0;
          do {
            if ((uVar14 != 0) && ((char)local_68 != '\0')) {
              fwrite("--------------------------------------------------------------------------------\n"
                     ,0x51,1,(FILE *)fout);
            }
            if (0 < num_requests) {
              poVar8 = requests;
              lVar9 = 0;
              do {
                print_info(*poVar8,(cpu_id_t *)(lStack_90 + uVar14 * 9000));
                lVar9 = lVar9 + 1;
                poVar8 = poVar8 + 1;
              } while (lVar9 < num_requests);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < (local_98 & 0xff));
        }
      }
    }
    if (need_cpulist != 0) {
      lVar9 = 0;
      do {
        fprintf((FILE *)fout,"-----%s-----\n",(&PTR_anon_var_dwarf_d3c_00108b70)[lVar9 * 2]);
        cpuid_get_cpu_list((&DAT_00108b78)[lVar9 * 4],local_40);
        if (0 < local_40[0]) {
          lVar12 = 0;
          do {
            fprintf((FILE *)fout,"%s\n",*(undefined8 *)(local_38 + lVar12 * 8));
            lVar12 = lVar12 + 1;
          } while (lVar12 < local_40[0]);
        }
        cpuid_free_cpu_list(local_40);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x1c);
    }
    uVar6 = uStack_60;
    lVar9 = lStack_90;
    if (need_sgx != 0) {
      pcVar13 = "present";
      pcVar10 = "present";
      if (*(uint *)(lStack_90 + 0x208) == 0) {
        pcVar10 = "absent";
      }
      fprintf((FILE *)fout,"SGX: %d (%s)\n",(ulong)*(uint *)(lStack_90 + 0x208),pcVar10);
      if (*(int *)(lVar9 + 0x208) != 0) {
        fprintf((FILE *)fout,"SGX max enclave size (32-bit): 2^%d\n",(ulong)*(byte *)(lVar9 + 0x20c)
               );
        fprintf((FILE *)fout,"SGX max enclave size (64-bit): 2^%d\n",(ulong)*(byte *)(lVar9 + 0x20d)
               );
        pcVar10 = "present";
        if (*(byte *)(lVar9 + 0x20e) == 0) {
          pcVar10 = "absent";
        }
        fprintf((FILE *)fout,"SGX1 extensions              : %d (%s)\n",
                (ulong)*(byte *)(lVar9 + 0x20e),pcVar10);
        if (*(byte *)(lVar9 + 0x20f) == 0) {
          pcVar13 = "absent";
        }
        fprintf((FILE *)fout,"SGX2 extensions              : %d (%s)\n",
                (ulong)*(byte *)(lVar9 + 0x20f),pcVar13);
        fprintf((FILE *)fout,"SGX MISCSELECT               : %08x\n",(ulong)*(uint *)(lVar9 + 0x220)
               );
        fprintf((FILE *)fout,"SGX SECS.ATTRIBUTES mask     : %016llx\n",
                *(undefined8 *)(lVar9 + 0x228));
        fprintf((FILE *)fout,"SGX SECS.XSAVE feature mask  : %016llx\n",
                *(undefined8 *)(lVar9 + 0x230));
        fprintf((FILE *)fout,"SGX EPC sections count       : %d\n",(ulong)*(uint *)(lVar9 + 0x21c));
        if (0 < *(int *)(lVar9 + 0x21c)) {
          uVar3 = 0;
          do {
            auVar17 = cpuid_get_epc(uVar3,uVar6);
            fprintf((FILE *)fout,"    SGX EPC section #%-8d: start = %llx, size = %llu\n",
                    (ulong)uVar3,auVar17._0_8_,auVar17._8_8_);
            uVar3 = uVar3 + 1;
          } while ((int)uVar3 < *(int *)(lVar9 + 0x21c));
        }
      }
    }
    if (need_hypervisor != 0) {
      iVar2 = cpuid_get_hypervisor(uStack_60,lStack_90);
      lVar9 = 8;
      pcVar10 = (char *)0x0;
      do {
        if (*(int *)((long)&PTR_anon_var_dwarf_f4c_00108d30 + lVar9) == iVar2) {
          pcVar10 = *(char **)(&UNK_00108d28 + lVar9);
          break;
        }
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x98);
      pcVar13 = "unknown";
      if (pcVar10 != (char *)0x0) {
        pcVar13 = pcVar10;
      }
      fprintf((FILE *)fout,"Hypervisor vendor: %s\n",pcVar13);
      if (iVar2 == 0) {
        fwrite("Caution: no hypervisor detected from CPUID bits, but a hypervisor may be hidden.\nRefer to https://github.com/anrieff/libcpuid/issues/90#issuecomment-296568713\n"
               ,0x9f,1,(FILE *)fout);
      }
    }
    cpuid_free_raw_data_array(&local_68);
    cpuid_free_system_id(&local_98);
LAB_001039b7:
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
    if (need_quiet == 0) {
      main_cold_13();
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
	int parseres = parse_cmdline(argc, argv);
	int i, readres, writeres;
	int only_clock_queries;
	uint8_t cpu_type_index;
	struct cpu_raw_data_array_t raw_array = {
		.with_affinity = false,
		.num_raw       = 0,
		.raw           = NULL
	};
	struct system_id_t data = {
		.num_cpu_types = 0
	};

	if (parseres != 1)
		return parseres;

	/* In quiet mode, disable libcpuid warning messages: */
	if (need_quiet)
		cpuid_set_warn_function(NULL);

	cpuid_set_verbosiness_level(verbose_level);

	/* Redirect output, if necessary: */
	if (strcmp(out_file, "") && strcmp(out_file, "-")) {
		fout = fopen(out_file, "wt");
		if (!fout) {
			if (!need_quiet)
				fprintf(stderr, "Cannot open `%s' for writing!\n", out_file);
			return -1;
		}
		atexit(close_out);
	} else {
		fout = stdout;
	}

	/* If requested, print library version: */
	if (need_version)
		fprintf(fout, "%s\n", cpuid_lib_version());

	if (need_input) {
		/* We have a request to input raw CPUID data from file: */
		if (!strcmp(raw_data_file, "-"))
			/* Input from stdin */
			readres = cpuid_deserialize_all_raw_data(&raw_array, "");
		else
			/* Input from file */
			readres = cpuid_deserialize_all_raw_data(&raw_array, raw_data_file);
		if (readres < 0) {
			if (!need_quiet) {
				fprintf(stderr, "Cannot deserialize raw data from ");
				if (!strcmp(raw_data_file, "-"))
					fprintf(stderr, "stdin\n");
				else
					fprintf(stderr, "file `%s'\n", raw_data_file);
				/* Print the error message */
				fprintf(stderr, "Error: %s\n", cpuid_error());
			}
			return -1;
		}
	} else {
		if (check_need_raw_data()) {
			/* Try to obtain raw CPUID data from the CPU: */
			readres = cpuid_get_all_raw_data(&raw_array);
			if (readres < 0) {
				if (!need_quiet) {
					fprintf(stderr, "Cannot obtain raw CPU data!\n");
					fprintf(stderr, "Error: %s\n", cpuid_error());
				}
				return -1;
			}
		}
	}

	/* Need to dump raw CPUID data to file: */
	if (need_output) {
		if (!strcmp(raw_data_file, "-"))
			/* Serialize to stdout */
			writeres = cpuid_serialize_all_raw_data(&raw_array, "");
		else
			/* Serialize to file */
			writeres = cpuid_serialize_all_raw_data(&raw_array, raw_data_file);
		if (writeres < 0) {
			if (!need_quiet) {
				fprintf(stderr, "Cannot serialize raw data to ");
				if (!strcmp(raw_data_file, "-"))
					fprintf(stderr, "stdout\n");
				else
					fprintf(stderr, "file `%s'\n", raw_data_file);
				/* Print the error message */
				fprintf(stderr, "Error: %s\n", cpuid_error());
			}
			return -1;
		}
	}
	if (need_report) {
		if (verbose_level >= 1) {
			printf("Writing decoded CPU report to `%s'\n", out_file);
		}
		/*
		 * Try CPU identification
		 * (this fill the `data' structure with decoded CPU features)
		 */
		if (cpu_identify_all(&raw_array, &data) < 0)
			fprintf(fout, "Error identifying the CPU: %s\n", cpuid_error());
		else if (data.num_cpu_types == 0)
			fprintf(fout, "The cpu_types array is empty: there is nothing to report\n");
		else {
			/* Write a thorough report of cpu_id_t structure to output (usually stdout) */
			fprintf(fout, "CPUID is present\n");
			/* OK, now write what we have in `data'...: */
			for (cpu_type_index = 0; cpu_type_index < data.num_cpu_types; cpu_type_index++) {
				fprintf(fout, "CPU Info for type #%d:\n------------------\n", cpu_type_index);
				fprintf(fout, "  arch       : %s\n", cpu_architecture_str(data.cpu_types[cpu_type_index].architecture));
				fprintf(fout, "  feat_level : %s\n", cpu_feature_level_str(data.cpu_types[cpu_type_index].feature_level));
				fprintf(fout, "  purpose    : %s\n", cpu_purpose_str(data.cpu_types[cpu_type_index].purpose));
				fprintf(fout, "  vendor_str : `%s'\n", data.cpu_types[cpu_type_index].vendor_str);
				fprintf(fout, "  vendor id  : %d\n", (int) data.cpu_types[cpu_type_index].vendor);
				fprintf(fout, "  brand_str  : `%s'\n", data.cpu_types[cpu_type_index].brand_str);
				if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_X86) {
					fprintf(fout, "  family     : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.family, data.cpu_types[cpu_type_index].x86.family);
					fprintf(fout, "  model      : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.model, data.cpu_types[cpu_type_index].x86.model);
					fprintf(fout, "  stepping   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.stepping, data.cpu_types[cpu_type_index].x86.stepping);
					fprintf(fout, "  ext_family : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.ext_family, data.cpu_types[cpu_type_index].x86.ext_family);
					fprintf(fout, "  ext_model  : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.ext_model, data.cpu_types[cpu_type_index].x86.ext_model);
				}
				else if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_ARM) {
					fprintf(fout, "  implementer: %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.implementer, data.cpu_types[cpu_type_index].arm.implementer);
					fprintf(fout, "  variant    : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.variant, data.cpu_types[cpu_type_index].arm.variant);
					fprintf(fout, "  part_num   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.part_num, data.cpu_types[cpu_type_index].arm.part_num);
					fprintf(fout, "  revision   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.revision, data.cpu_types[cpu_type_index].arm.revision);
				}
				fprintf(fout, "  num_cores  : %d\n", data.cpu_types[cpu_type_index].num_cores);
				fprintf(fout, "  num_logical: %d\n", data.cpu_types[cpu_type_index].num_logical_cpus);
				fprintf(fout, "  tot_logical: %d\n", data.cpu_types[cpu_type_index].total_logical_cpus);
				fprintf(fout, "  affi_mask  : 0x%s\n", affinity_mask_str(&data.cpu_types[cpu_type_index].affinity_mask));
				if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_X86) {
					fprintf(fout, "  L1 D cache : %d KB\n", data.cpu_types[cpu_type_index].l1_data_cache);
					fprintf(fout, "  L1 I cache : %d KB\n", data.cpu_types[cpu_type_index].l1_instruction_cache);
					fprintf(fout, "  L2 cache   : %d KB\n", data.cpu_types[cpu_type_index].l2_cache);
					fprintf(fout, "  L3 cache   : %d KB\n", data.cpu_types[cpu_type_index].l3_cache);
					fprintf(fout, "  L4 cache   : %d KB\n", data.cpu_types[cpu_type_index].l4_cache);
					fprintf(fout, "  L1D assoc. : %d-way\n", data.cpu_types[cpu_type_index].l1_data_assoc);
					fprintf(fout, "  L1I assoc. : %d-way\n", data.cpu_types[cpu_type_index].l1_instruction_assoc);
					fprintf(fout, "  L2 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l2_assoc);
					fprintf(fout, "  L3 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l3_assoc);
					fprintf(fout, "  L4 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l4_assoc);
					fprintf(fout, "  L1D line sz: %d bytes\n", data.cpu_types[cpu_type_index].l1_data_cacheline);
					fprintf(fout, "  L1I line sz: %d bytes\n", data.cpu_types[cpu_type_index].l1_instruction_cacheline);
					fprintf(fout, "  L2 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l2_cacheline);
					fprintf(fout, "  L3 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l3_cacheline);
					fprintf(fout, "  L4 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l4_cacheline);
					fprintf(fout, "  L1D inst.  : %d\n", data.cpu_types[cpu_type_index].l1_data_instances);
					fprintf(fout, "  L1I inst.  : %d\n", data.cpu_types[cpu_type_index].l1_instruction_instances);
					fprintf(fout, "  L2 inst.   : %d\n", data.cpu_types[cpu_type_index].l2_instances);
					fprintf(fout, "  L3 inst.   : %d\n", data.cpu_types[cpu_type_index].l3_instances);
					fprintf(fout, "  L4 inst.   : %d\n", data.cpu_types[cpu_type_index].l4_instances);
					fprintf(fout, "  SSE units  : %d bits (%s)\n", data.cpu_types[cpu_type_index].x86.sse_size, data.cpu_types[cpu_type_index].detection_hints[CPU_HINT_SSE_SIZE_AUTH] ? "authoritative" : "non-authoritative");
				}
				fprintf(fout, "  code name  : `%s'\n", data.cpu_types[cpu_type_index].cpu_codename);
				fprintf(fout, "  features   :");
				/*
				* Here we enumerate all CPU feature bits, and when a feature
				* is present output its name:
				*/
				for (i = 0; i < NUM_CPU_FEATURES; i++)
					if (data.cpu_types[cpu_type_index].flags[i])
						fprintf(fout, " %s", cpu_feature_str(i));
				fprintf(fout, "\n");
			}
		}

		/* Is CPU clock info requested? */
		if (need_clockreport) {
			if (need_timed_clockreport) {
				/* Here we use the RDTSC-based routine */
				fprintf(fout, "  cpu clock  : %d MHz\n",
				        cpu_clock_measure(400, 1));
			} else {
				/* Here we use the OS-provided info */
				fprintf(fout, "  cpu clock  : %d MHz\n",
				        cpu_clock());
			}
		}
	}
	/*
	 * Check if we have any queries to process.
	 * We have to handle the case when `--clock' or `--clock-rdtsc' options
	 * are present.
	 * If in report mode, this will generate spurious output after the
	 * report, if not handled explicitly.
	 */
	only_clock_queries = 1;
	for (i = 0; i < num_requests; i++)
		if (requests[i] != NEED_CLOCK && requests[i] != NEED_CLOCK_RDTSC) {
			only_clock_queries = 0;
			break;
		}
	/* OK, process all queries. */
	if (((!need_report || !only_clock_queries) && num_requests > 0) || need_identify) {
		if (check_need_raw_data()) {
			/* Identify the CPU. Make it do cpuid_get_all_raw_data() itself */
			if (cpu_identify_all(&raw_array, &data) < 0) {
				if (!need_quiet)
					fprintf(stderr,
							"Error identifying the CPU: %s\n",
							cpuid_error());
				return -1;
			}

			for (cpu_type_index = 0; cpu_type_index < data.num_cpu_types; cpu_type_index++) {
				if (raw_array.with_affinity && (cpu_type_index > 0))
					fprintf(fout, "--------------------------------------------------------------------------------\n");
				for (i = 0; i < num_requests; i++)
					print_info(requests[i], &data.cpu_types[cpu_type_index]);
			}
		}
		else
			for (i = 0; i < num_requests; i++)
				print_info(requests[i], NULL);
	}
	if (need_cpulist) {
		print_cpulist();
	}
	if (need_sgx) {
		print_sgx_data(&raw_array.raw[0], &data.cpu_types[0]);
	}
	if (need_hypervisor) {
		print_hypervisor(&raw_array.raw[0], &data.cpu_types[0]);
	}

	cpuid_free_raw_data_array(&raw_array);
	cpuid_free_system_id(&data);
	return 0;
}